

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O0

sample_type __thiscall
charls::jls_codec<charls::default_traits<unsigned_char,_unsigned_char>,_charls::encoder_strategy>::
do_regular(jls_codec<charls::default_traits<unsigned_char,_unsigned_char>,_charls::encoder_strategy>
           *this,int32_t qs,int32_t x,int32_t predicted,encoder_strategy *param_4)

{
  byte bVar1;
  bool bVar2;
  uchar uVar3;
  int32_t iVar4;
  int32_t iVar5;
  uint k_00;
  int i;
  int32_t iVar6;
  uint error_value_00;
  uint uVar7;
  reference this_00;
  void *extraout_RDX;
  void *__n;
  int32_t error_value;
  int32_t predicted_value;
  int32_t k;
  context_regular_mode *context;
  int32_t sign;
  encoder_strategy *param_4_local;
  int32_t predicted_local;
  int32_t x_local;
  int32_t qs_local;
  jls_codec<charls::default_traits<unsigned_char,_unsigned_char>,_charls::encoder_strategy>
  *this_local;
  
  iVar4 = bit_wise_sign(qs);
  iVar5 = apply_sign(qs,iVar4);
  __n = (void *)(long)iVar5;
  this_00 = std::array<charls::context_regular_mode,_365UL>::operator[]
                      (&this->contexts_,(size_type)__n);
  k_00 = context_regular_mode::get_golomb_coding_parameter(this_00);
  i = context_regular_mode::c(this_00,__n,extraout_RDX);
  iVar5 = apply_sign(i,iVar4);
  iVar5 = default_traits<unsigned_char,_unsigned_char>::correct_prediction
                    (&this->traits_,predicted + iVar5);
  iVar6 = apply_sign(x - iVar5,iVar4);
  error_value_00 =
       default_traits<unsigned_char,_unsigned_char>::compute_error_value(&this->traits_,iVar6);
  uVar7 = context_regular_mode::get_error_correction(this_00,k_00 | (this->traits_).near_lossless);
  iVar6 = map_error_value(uVar7 ^ error_value_00);
  encode_mapped_value(this,k_00,iVar6,(this->traits_).limit);
  context_regular_mode::update_variables_and_bias
            (this_00,error_value_00,(this->traits_).near_lossless,(this->traits_).reset_threshold);
  iVar6 = apply_sign(error_value_00,iVar4);
  bVar1 = default_traits<unsigned_char,_unsigned_char>::compute_reconstructed_sample
                    (&this->traits_,iVar5,iVar6);
  bVar2 = default_traits<unsigned_char,_unsigned_char>::is_near(&this->traits_,(uint)bVar1,x);
  if (!bVar2) {
    __assert_fail("traits_.is_near(traits_.compute_reconstructed_sample(predicted_value, apply_sign(error_value, sign)), x)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/scan.h"
                  ,0x15c,
                  "sample_type charls::jls_codec<charls::default_traits<unsigned char, unsigned char>, charls::encoder_strategy>::do_regular(const int32_t, const int32_t, const int32_t, encoder_strategy *) [Traits = charls::default_traits<unsigned char, unsigned char>, Strategy = charls::encoder_strategy]"
                 );
  }
  iVar4 = apply_sign(error_value_00,iVar4);
  uVar3 = default_traits<unsigned_char,_unsigned_char>::compute_reconstructed_sample
                    (&this->traits_,iVar5,iVar4);
  return uVar3;
}

Assistant:

do_regular(const int32_t qs, const int32_t x, const int32_t predicted,
                                        encoder_strategy* /*template_selector*/)
    {
        const int32_t sign{bit_wise_sign(qs)};
        context_regular_mode& context{contexts_[apply_sign(qs, sign)]};
        const int32_t k{context.get_golomb_coding_parameter()};
        const int32_t predicted_value{traits_.correct_prediction(predicted + apply_sign(context.c(), sign))};
        const int32_t error_value{traits_.compute_error_value(apply_sign(x - predicted_value, sign))};

        encode_mapped_value(k, map_error_value(context.get_error_correction(k | traits_.near_lossless) ^ error_value),
                            traits_.limit);
        context.update_variables_and_bias(error_value, traits_.near_lossless, traits_.reset_threshold);
        ASSERT(traits_.is_near(traits_.compute_reconstructed_sample(predicted_value, apply_sign(error_value, sign)), x));
        return static_cast<sample_type>(
            traits_.compute_reconstructed_sample(predicted_value, apply_sign(error_value, sign)));
    }